

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  Board *this;
  bool local_2041;
  int anon_var_0;
  undefined1 local_2010 [8];
  SearchInfo info;
  allocator<char> local_1fc9;
  string local_1fc8;
  string local_1fa8;
  byte local_1f81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f80;
  allocator<char> local_1f59;
  string local_1f58;
  vector<board::Undo,_std::allocator<board::Undo>_> local_1f38;
  undefined1 local_1f20 [8];
  string input;
  undefined1 local_1ef0 [8];
  Move move;
  Board pos;
  
  board::Board::INIT();
  search::movegen::INIT();
  board::Board::Board((Board *)&move);
  board::Move::Move((Move *)local_1ef0);
  std::__cxx11::string::string((string *)local_1f20);
  while( true ) {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    board::Board::print((Board *)&move);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    board::Board::getHistory(&local_1f38,(Board *)&move);
    sVar4 = std::vector<board::Undo,_std::allocator<board::Undo>_>::size(&local_1f38);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(sVar4 >> 1) + 1);
    std::operator<<(poVar5,": ");
    std::vector<board::Undo,_std::allocator<board::Undo>_>::~vector(&local_1f38);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_1f20);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1f20,"uci");
    if (bVar2) break;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1f20,"q");
    if (bVar2) goto LAB_00103e2c;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1f20,"n");
    pcVar1 = board::Board::DEFAULT_FEN;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f58,pcVar1,&local_1f59);
      board::Board::parseFen((Board *)&move,&local_1f58);
      std::__cxx11::string::~string((string *)&local_1f58);
      std::allocator<char>::~allocator(&local_1f59);
    }
    else {
      uVar6 = std::__cxx11::string::length();
      local_1f81 = 0;
      local_2041 = false;
      if (2 < uVar6) {
        std::__cxx11::string::substr((ulong)&local_1f80,(ulong)local_1f20);
        local_1f81 = 1;
        local_2041 = std::operator==(&local_1f80,"n ");
      }
      if ((local_1f81 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1f80);
      }
      if (local_2041 == false) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f20,"u");
        if (bVar2) {
          board::Board::getHistory
                    ((vector<board::Undo,_std::allocator<board::Undo>_> *)&info.quit,(Board *)&move)
          ;
          bVar2 = std::vector<board::Undo,_std::allocator<board::Undo>_>::empty
                            ((vector<board::Undo,_std::allocator<board::Undo>_> *)&info.quit);
          std::vector<board::Undo,_std::allocator<board::Undo>_>::~vector
                    ((vector<board::Undo,_std::allocator<board::Undo>_> *)&info.quit);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            board::makemove::undo((Board *)&move);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f20,"s");
          if (bVar2) {
            std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
            search::SearchInfo::SearchInfo((SearchInfo *)local_2010,-1);
            search::go();
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1f20,"e");
            if (bVar2) {
              std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>)
              ;
              poVar5 = std::operator<<((ostream *)&std::cout,"Evaluation: ");
              iVar3 = board::evaluate::score((Board *)&move);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            else {
              local_1ef0 = (undefined1  [8])io::parseMove((string *)local_1f20,(Board *)&move);
              this = (Board *)local_1ef0;
              bVar2 = board::makemove::move((Move *)this,(Board *)&move);
              if (!bVar2) {
                __cxa_rethrow();
                board::Board::Board(this);
                return extraout_EAX;
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_1fa8,(ulong)local_1f20);
        bVar2 = board::Board::parseFen((Board *)&move,&local_1fa8);
        std::__cxx11::string::~string((string *)&local_1fa8);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::cout,"ERROR Invalid FEN");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = board::Board::DEFAULT_FEN;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1fc8,pcVar1,&local_1fc9);
          board::Board::parseFen((Board *)&move,&local_1fc8);
          std::__cxx11::string::~string((string *)&local_1fc8);
          std::allocator<char>::~allocator(&local_1fc9);
        }
      }
    }
  }
  io::uci::loop();
LAB_00103e2c:
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1f20);
  board::Board::~Board((Board *)&move);
  return 0;
}

Assistant:

int main()
{
    board::Board::INIT();
    search::movegen::INIT();
    board::Board pos;
    board::Move move;
    std::string input;
    while (true) {
        std::cout << std::endl;
        pos.print();
        std::cout << std::endl;
        std::cout << ((pos.getHistory().size() / 2) + 1) << ": ";
        std::getline(std::cin, input);
        if (input == "uci") {
            io::uci::loop();
            break;
        }
        if (input == "q") {
            break;
        }
        if (input == "n") {
            pos.parseFen(board::Board::DEFAULT_FEN);
        }
        else if (input.length() > 2 && input.substr(0, 2) == "n ") {
            if (!pos.parseFen(input.substr(2))) {
                std::cout << std::endl;
                std::cout << "ERROR Invalid FEN" << std::endl;
                pos.parseFen(board::Board::DEFAULT_FEN);
            }
        }
        else if (input == "u") {
            if (!pos.getHistory().empty()) {
                board::makemove::undo(pos);
            }
        }
        else if (input == "s") {
            std::cout << std::endl;
            search::SearchInfo info(-1);
            search::go(pos, info);
        }
        else if (input == "e") {
            std::cout << std::endl;
            std::cout << "Evaluation: " << board::evaluate::score(pos) << std::endl;
        }
        else {
            try {
                move = io::parseMove(input, pos);
                if (!board::makemove::move(move, pos)) {
                    throw;
                }
            }
            catch (int) {
                std::cout << std::endl;
                std::cout << "ERROR Invalid input" << std::endl;
            }
        }
    }
    std::cout << std::endl;
    return 0;
}